

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLgraph.c
# Opt level: O0

uint RDL_addToEdgeArray(RDL_graph *gra,uint from,uint to)

{
  uint **ppuVar1;
  uint *puVar2;
  uint local_18;
  uint temp;
  uint to_local;
  uint from_local;
  RDL_graph *gra_local;
  
  local_18 = to;
  temp = from;
  if (to < from) {
    local_18 = from;
    temp = to;
  }
  if (gra->E == gra->edgesAlloced) {
    gra->edgesAlloced = gra->edgesAlloced << 1;
    ppuVar1 = (uint **)realloc(gra->edges,(ulong)gra->edgesAlloced << 3);
    gra->edges = ppuVar1;
  }
  puVar2 = (uint *)malloc(8);
  gra->edges[gra->E - 1] = puVar2;
  *gra->edges[gra->E - 1] = temp;
  gra->edges[gra->E - 1][1] = local_18;
  return gra->E - 1;
}

Assistant:

static unsigned RDL_addToEdgeArray(RDL_graph *gra, unsigned from, unsigned to)
{
  unsigned temp;
  if(from > to)
  {
    temp = from;
    from = to;
    to = temp;
  }
  if(gra->E == gra->edgesAlloced)
  {
    gra->edgesAlloced *= 2;
    gra->edges = realloc(gra->edges, gra->edgesAlloced * sizeof(*gra->edges));
  }
  gra->edges[gra->E-1] = malloc(2 * sizeof(**gra->edges));
  gra->edges[gra->E-1][0] = from;
  gra->edges[gra->E-1][1] = to;

  return gra->E-1;
}